

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t skip_base_block(archive_read *a)

{
  rar5 *prVar1;
  archive_entry *entry_00;
  archive_entry *entry;
  rar5 *rar;
  wchar_t ret;
  archive_read *a_local;
  
  prVar1 = get_context(a);
  entry_00 = archive_entry_new();
  a_local._4_4_ = process_base_block(a,entry_00);
  archive_entry_free(entry_00);
  if (a_local._4_4_ != L'\xffffffe2') {
    if (((prVar1->generic).last_header_id == L'\x02') && ((*(byte *)&prVar1->generic >> 1 & 1) != 0)
       ) {
      a_local._4_4_ = L'\0';
    }
    else if (a_local._4_4_ == L'\0') {
      a_local._4_4_ = L'\xfffffff6';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int skip_base_block(struct archive_read* a) {
	int ret;
	struct rar5* rar = get_context(a);

	/* Create a new local archive_entry structure that will be operated on
	 * by header reader; operations on this archive_entry will be discarded.
	 */
	struct archive_entry* entry = archive_entry_new();
	ret = process_base_block(a, entry);

	/* Discard operations on this archive_entry structure. */
	archive_entry_free(entry);
	if(ret == ARCHIVE_FATAL)
		return ret;

	if(rar->generic.last_header_id == 2 && rar->generic.split_before > 0)
		return ARCHIVE_OK;

	if(ret == ARCHIVE_OK)
		return ARCHIVE_RETRY;
	else
		return ret;
}